

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_6::ToProperty<float>
               (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *input,Property *output,
               string *err)

{
  bool bVar1;
  Variability *pVVar2;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  Animatable<float> *pAVar3;
  TypedTimeSamples<float> *ts_00;
  AttrMeta *pAVar4;
  AttrMeta *this;
  Property local_980;
  int local_39c;
  undefined1 local_398 [8];
  Value val;
  undefined1 local_378 [4];
  float a;
  TimeSamples ts;
  PrimVar pvar;
  Animatable<float> v;
  undefined1 local_2d0 [8];
  Attribute attr;
  string *err_local;
  Property *output_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *input_local;
  
  attr._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)err;
  Attribute::Attribute((Attribute *)local_2d0);
  pVVar2 = Attribute::variability((Attribute *)local_2d0);
  *pVVar2 = Varying;
  tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
  Attribute::set_type_name((Attribute *)local_2d0,(string *)&v._ts._dirty);
  ::std::__cxx11::string::~string((string *)&v._ts._dirty);
  bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::is_blocked(input);
  if (bVar1) {
    bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::is_blocked(input);
    Attribute::set_blocked((Attribute *)local_2d0,bVar1);
  }
  bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::has_connections(input);
  if (bVar1) {
    paths = TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::get_connections(input);
    Attribute::set_connections((Attribute *)local_2d0,paths);
  }
  pAVar3 = TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::get_value(input);
  Animatable<float>::Animatable((Animatable<float> *)&pvar._ts._dirty,pAVar3);
  primvar::PrimVar::PrimVar((PrimVar *)&ts._dirty);
  bVar1 = Animatable<float>::has_timesamples((Animatable<float> *)&pvar._ts._dirty);
  if (bVar1) {
    ts_00 = Animatable<float>::get_timesamples((Animatable<float> *)&pvar._ts._dirty);
    ToTypelessTimeSamples<float>((TimeSamples *)local_378,ts_00);
    primvar::PrimVar::set_timesamples((PrimVar *)&ts._dirty,(TimeSamples *)local_378);
    tinyusdz::value::TimeSamples::~TimeSamples((TimeSamples *)local_378);
  }
  bVar1 = Animatable<float>::has_value((Animatable<float> *)&pvar._ts._dirty);
  if (bVar1) {
    bVar1 = Animatable<float>::get_scalar
                      ((Animatable<float> *)&pvar._ts._dirty,(float *)((long)&val.v_.vtable + 4));
    if (!bVar1) {
      if (attr._metas.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        ::std::__cxx11::string::operator+=
                  ((string *)
                   attr._metas.stringData.
                   super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "[InternalError] Invalid Animatable value.");
      }
      input_local._7_1_ = 0;
      local_39c = 1;
      goto LAB_007de7d6;
    }
    tinyusdz::value::Value::Value<float>((Value *)local_398,(float *)((long)&val.v_.vtable + 4));
    primvar::PrimVar::set_value<tinyusdz::value::Value>((PrimVar *)&ts._dirty,(Value *)local_398);
    tinyusdz::value::Value::~Value((Value *)local_398);
  }
  Attribute::set_var((Attribute *)local_2d0,(PrimVar *)&ts._dirty);
  local_39c = 0;
LAB_007de7d6:
  primvar::PrimVar::~PrimVar((PrimVar *)&ts._dirty);
  Animatable<float>::~Animatable((Animatable<float> *)&pvar._ts._dirty);
  if (local_39c == 0) {
    pAVar4 = TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::metas(input);
    this = Attribute::metas((Attribute *)local_2d0);
    AttrMetas::operator=(this,pAVar4);
    Property::Property(&local_980,(Attribute *)local_2d0,false);
    Property::operator=(output,&local_980);
    Property::~Property(&local_980);
    input_local._7_1_ = 1;
    local_39c = 1;
  }
  Attribute::~Attribute((Attribute *)local_2d0);
  return (bool)(input_local._7_1_ & 1);
}

Assistant:

bool ToProperty(const TypedAttributeWithFallback<Animatable<T>> &input,
                Property &output, std::string *err) {
#if 0
  if (input.is_blocked()) {
    Attribute attr;
    attr.set_blocked(input.is_blocked());
    attr.variability() = Variability::Uniform;
    attr.set_type_name(value::TypeTraits<T>::type_name());
    output = Property(std::move(attr), /*custom*/ false);
  } else if (input.is_value_empty()) {
    // type info only
    Property p;
    p.set_property_type(Property::Type::EmptyAttrib);
    p.attribute().set_type_name(value::TypeTraits<T>::type_name());
    p.set_custom(false);
    output = p;
  } else if (input.is_connection()) {
    // Use Relation for Connection(as typed relationshipTarget)
    // Single connection targetPath only.
    Relationship rel;
    std::vector<Path> pv = input.get_connections();
    if (pv.empty()) {
      DCOUT("??? Empty connectionTarget.");
      if (err) {
        (*err) += "[InternalError] Empty connectionTarget.";
      }
      return false;
    }
    if (pv.size() == 1) {
      DCOUT("targetPath = " << pv[0]);
      output = Property(pv[0], /* type */ value::TypeTraits<T>::type_name(),
                        /* custom */ false);
    } else if (pv.size() > 1) {
      output = Property(pv, /* type */ value::TypeTraits<T>::type_name(),
                        /* custom */ false);
    } else {
      DCOUT("??? GetConnection faile.");
      if (err) {
        (*err) += "[InternalError] Invalid connectionTarget.";
      }
      return false;
    }

  } else {
    // Includes !authored()
    // FIXME: Currently scalar only.
    Animatable<T> v = input.get_value();

    primvar::PrimVar pvar;

    if (v.is_timesamples()) {
      value::TimeSamples ts = ToTypelessTimeSamples(v.get_timesamples());
      pvar.set_timesamples(ts);
    } else if (v.is_scalar()) {
      T a;
      if (v.get_scalar(&a)) {
        value::Value val(a);
        pvar.set_value(val);
      } else {
        DCOUT("??? Invalid Animatable value.");
        if (err) {
          (*err) += "[InternalError] Invalid Animatable value.";
        }
        return false;
      }
    } else {
      DCOUT("??? Invalid Animatable value.");
      if (err) {
        (*err) += "[InternalError] Invalid Animatable value.";
      }
      return false;
    }

    Attribute attr;
    attr.set_var(std::move(pvar));
    attr.variability() = Variability::Varying;
    output = Property(attr, /* custom */ false);
  }
#else

  Attribute attr;
  attr.variability() = Variability::Varying;
  attr.set_type_name(value::TypeTraits<T>::type_name());

  DCOUT("has_connections " << input.has_connections());

  if (input.is_blocked()) {
    attr.set_blocked(input.is_blocked());
  }

  if (input.has_connections()) {
    attr.set_connections(input.get_connections());
  }

  {
    // Includes !authored()
    // FIXME: Currently scalar only.
    Animatable<T> v = input.get_value();

    primvar::PrimVar pvar;
    DCOUT("has_timesamples " << v.has_timesamples());
    DCOUT("has_value " << v.has_value());

    if (v.has_timesamples()) {
      value::TimeSamples ts = ToTypelessTimeSamples(v.get_timesamples());
      pvar.set_timesamples(ts);
    }

    if (v.has_value()) {
      T a;
      if (v.get_scalar(&a)) {
        value::Value val(a);
        pvar.set_value(val);
      } else {
        DCOUT("??? Invalid Animatable value.");
        if (err) {
          (*err) += "[InternalError] Invalid Animatable value.";
        }
        return false;
      }
    }

    attr.set_var(std::move(pvar));
  }

  attr.metas() = input.metas();

  output = Property(std::move(attr), /* custom */ false);

#endif

  return true;
}